

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::DDLNodeTest_accessTypeTest_Test::~DDLNodeTest_accessTypeTest_Test
          (DDLNodeTest_accessTypeTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DDLNodeTest, accessTypeTest) {
    static const std::string type1 = "type";
    static const std::string name1 = "test";
    DDLNode *myNode = DDLNode::create(type1, name1);
    EXPECT_EQ(type1, myNode->getType());
    EXPECT_EQ(name1, myNode->getName());

    static const std::string type2 = "type2";
    myNode->setType(type2);
    EXPECT_EQ(type2, myNode->getType());
    delete myNode;
}